

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::FragmentStamp::addInversionStamp(FragmentStamp *this,InversionStamp *inversion)

{
  InversionStamp *local_8;
  
  local_8 = inversion;
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::push_back
            (&this->inversionStamps_,&local_8);
  return true;
}

Assistant:

bool FragmentStamp::addInversionStamp(InversionStamp* inversion) {
    inversionStamps_.push_back(inversion);
    return true;
  }